

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment *ls1,LineSegment *ls2,int *pwhich)

{
  uint uVar1;
  uint uVar2;
  double dVar3;
  double dVar5;
  undefined1 auVar4 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar8 = ls1->ex - ls2->ex;
  dVar3 = ls1->sx - ls2->ex;
  dVar5 = ls1->sx - ls2->sx;
  dVar10 = ls1->ey - ls2->ey;
  dVar6 = ls1->sy - ls2->ey;
  dVar7 = ls1->sy - ls2->sy;
  auVar4._0_8_ = dVar3 * dVar3 + dVar6 * dVar6;
  auVar4._8_8_ = dVar5 * dVar5 + dVar7 * dVar7;
  auVar4 = sqrtpd(auVar4,auVar4);
  dVar6 = auVar4._8_8_;
  dVar5 = auVar4._0_8_;
  dVar3 = dVar5;
  if (dVar6 <= dVar5) {
    dVar3 = dVar6;
  }
  dVar9 = ls1->ex - ls2->sx;
  dVar7 = ls1->ey - ls2->sy;
  dVar9 = SQRT(dVar9 * dVar9 + dVar7 * dVar7);
  dVar7 = dVar9;
  if (dVar3 <= dVar9) {
    dVar7 = dVar3;
  }
  dVar8 = SQRT(dVar8 * dVar8 + dVar10 * dVar10);
  if (pwhich != (int *)0x0) {
    uVar2 = 2;
    if (dVar3 <= dVar9) {
      uVar2 = (uint)(dVar5 < dVar6);
    }
    uVar1 = 3;
    if (dVar7 <= dVar8) {
      uVar1 = uVar2;
    }
    *pwhich = uVar1;
  }
  if (dVar7 <= dVar8) {
    dVar8 = dVar7;
  }
  return dVar8;
}

Assistant:

double EDLines::ComputeMinDistanceBetweenTwoLines(LineSegment * ls1, LineSegment * ls2, int * pwhich)
{
	double dx = ls1->sx - ls2->sx;
	double dy = ls1->sy - ls2->sy;
	double d = sqrt(dx*dx + dy*dy);
	double min = d;
	int which = SS;

	dx = ls1->sx - ls2->ex;
	dy = ls1->sy - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = SE; }

	dx = ls1->ex - ls2->sx;
	dy = ls1->ey - ls2->sy;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = ES; }

	dx = ls1->ex - ls2->ex;
	dy = ls1->ey - ls2->ey;
	d = sqrt(dx*dx + dy*dy);
	if (d < min) { min = d; which = EE; }

	if (pwhich) *pwhich = which;
	return min;
}